

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void debug_print_line_by_line(mbedtls_ssl_context *ssl,int level,char *file,int line,char *text)

{
  size_t local_250;
  size_t len;
  char *cur;
  char *start;
  char str [512];
  char *text_local;
  int line_local;
  char *file_local;
  int level_local;
  mbedtls_ssl_context *ssl_local;
  
  cur = text;
  for (len = (size_t)text; *(char *)len != '\0'; len = len + 1) {
    if (*(char *)len == '\n') {
      local_250 = (len - (long)cur) + 1;
      if (0x1ff < local_250) {
        local_250 = 0x1ff;
      }
      memcpy(&start,cur,local_250);
      str[local_250 - 8] = '\0';
      debug_send_line(ssl,level,file,line,(char *)&start);
      cur = (char *)(len + 1);
    }
  }
  return;
}

Assistant:

static void debug_print_line_by_line( const mbedtls_ssl_context *ssl, int level,
                                      const char *file, int line, const char *text )
{
    char str[DEBUG_BUF_SIZE];
    const char *start, *cur;

    start = text;
    for( cur = text; *cur != '\0'; cur++ )
    {
        if( *cur == '\n' )
        {
            size_t len = cur - start + 1;
            if( len > DEBUG_BUF_SIZE - 1 )
                len = DEBUG_BUF_SIZE - 1;

            memcpy( str, start, len );
            str[len] = '\0';

            debug_send_line( ssl, level, file, line, str );

            start = cur + 1;
        }
    }
}